

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<char>>::hex_writer>
             *this,char **it)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  ulong uVar4;
  char *digits;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __len;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  
  lVar2 = *(long *)(this + 0x10);
  pcVar10 = *it;
  if (lVar2 != 0) {
    lVar3 = *(long *)(this + 8);
    lVar6 = 0;
    do {
      pcVar10[lVar6] = *(char *)(lVar3 + lVar6);
      lVar6 = lVar6 + 1;
    } while (lVar2 != lVar6);
    pcVar10 = pcVar10 + lVar6;
    *it = pcVar10;
  }
  __n = *(size_t *)(this + 0x20);
  pcVar9 = pcVar10;
  if (__n != 0) {
    pcVar9 = pcVar10 + __n;
    memset(pcVar10,*(int *)(this + 0x18),__n);
  }
  *it = pcVar9;
  lVar2 = *(long *)(this + 0x28);
  iVar1 = *(int *)(this + 0x30);
  if (*(char *)(*(long *)(lVar2 + 8) + 8) == 'x') {
    pcVar5 = (char *)&basic_data<void>::hex_digits;
  }
  else {
    pcVar5 = "0123456789ABCDEF";
  }
  pcVar10 = pcVar10 + __n + (long)iVar1;
  uVar7 = *(ulong *)(lVar2 + 0x10);
  uVar8 = *(ulong *)(lVar2 + 0x18);
  do {
    pcVar10 = pcVar10 + -1;
    *pcVar10 = pcVar5[(uint)uVar7 & 0xf];
    bVar11 = 0xf < uVar7;
    bVar12 = uVar8 != 0;
    uVar4 = -uVar8;
    uVar7 = uVar8 << 0x3c | uVar7 >> 4;
    uVar8 = uVar8 >> 4;
  } while (bVar12 || uVar4 < bVar11);
  *it = pcVar9 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }